

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SPF.cpp
# Opt level: O0

void __thiscall
OpenMD::RNEMD::SPFMethod::SPFMethod(SPFMethod *this,SimInfo *info,ForceManager *forceMan)

{
  RNEMDFluxType RVar1;
  value_type pMVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  Globals *this_00;
  size_type sVar8;
  reference ppMVar9;
  MoleculeStamp *pMVar10;
  reference pvVar11;
  reference pvVar12;
  undefined8 uVar13;
  long in_RDX;
  SimInfo *in_RSI;
  RNEMD *in_RDI;
  RNEMD *this_01;
  RealType RVar14;
  bool hasCorrectFlux;
  bool methodFluxMismatch;
  bool hasKineticFlux;
  bool hasCurrentDensity;
  bool hasParticleFlux;
  string ionStr;
  SelectionManager ionManager;
  SelectionEvaluator ionEvaluator;
  size_t i_2;
  size_t i_1;
  vector<int,_std::allocator<int>_> molCount;
  vector<double,_std::allocator<double>_> q_tot;
  Molecule *mol;
  MoleculeIterator i;
  RNEMDParameters *rnemdParams;
  SPFForceManager *spfForceManager;
  ForceManager *in_stack_00000e20;
  SimInfo *in_stack_00000e28;
  RNEMD *in_stack_00000e30;
  undefined7 in_stack_fffffffffffff7c8;
  undefined1 in_stack_fffffffffffff7cf;
  SelectionEvaluator *in_stack_fffffffffffff7d0;
  SelectionManager *in_stack_fffffffffffff7d8;
  RNEMD *in_stack_fffffffffffff7e0;
  MoleculeIterator *in_stack_fffffffffffff7e8;
  SimInfo *in_stack_fffffffffffff7f0;
  errorStruct *peVar15;
  bool local_801;
  SelectionEvaluator *in_stack_fffffffffffff808;
  Molecule *in_stack_fffffffffffff818;
  SelectionEvaluator *in_stack_fffffffffffff820;
  long local_780;
  SelectionEvaluator *this_02;
  bool local_725;
  string local_708 [32];
  string local_6e8 [352];
  SimInfo *in_stack_fffffffffffffa78;
  SelectionManager *in_stack_fffffffffffffa80;
  ulong local_b0;
  ulong local_a8;
  vector<int,_std::allocator<int>_> local_98;
  vector<double,_std::allocator<double>_> local_78;
  Molecule *local_60;
  _Rb_tree_iterator<std::pair<const_int,_OpenMD::Molecule_*>_> local_58;
  RNEMDParameters *local_50;
  long local_48;
  long local_18;
  SimInfo *local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  RNEMD::RNEMD(in_stack_00000e30,in_stack_00000e28,in_stack_00000e20);
  in_RDI->_vptr_RNEMD = (_func_int **)&PTR__SPFMethod_0050b7f8;
  in_RDI[1]._vptr_RNEMD = (_func_int **)0x0;
  this_02 = (SelectionEvaluator *)&in_RDI[1].info_;
  SelectionManager::SelectionManager(in_stack_fffffffffffffa80,in_stack_fffffffffffffa78);
  SelectionManager::SelectionManager(in_stack_fffffffffffffa80,in_stack_fffffffffffffa78);
  SelectionManager::SelectionManager(in_stack_fffffffffffffa80,in_stack_fffffffffffffa78);
  SelectionManager::SelectionManager(in_stack_fffffffffffffa80,in_stack_fffffffffffffa78);
  in_RDI[1].trialCount_ = 0;
  in_RDI[1].failTrialCount_ = 0;
  std::__cxx11::string::string((string *)&in_RDI[1].failRootCount_);
  SelectionEvaluator::SelectionEvaluator(this_02,(SimInfo *)in_RDI);
  SelectionManager::SelectionManager(in_stack_fffffffffffffa80,in_stack_fffffffffffffa78);
  *(undefined1 *)
   ((long)&in_RDI[1].seleMan_.molecules_.
           super__Vector_base<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage + 1) = 0;
  std::__cxx11::string::operator=((string *)&in_RDI->rnemdMethodLabel_,"SPF");
  std::__cxx11::string::operator=((string *)&in_RDI[1].failRootCount_,"select none");
  SelectionEvaluator::loadScriptString
            (in_stack_fffffffffffff820,(string *)in_stack_fffffffffffff818);
  SelectionEvaluator::evaluate(in_stack_fffffffffffff808);
  SelectionManager::setSelectionSet
            ((SelectionManager *)in_stack_fffffffffffff7e0,(SelectionSet *)in_stack_fffffffffffff7d8
            );
  SelectionSet::~SelectionSet((SelectionSet *)0x355748);
  if (local_18 == 0) {
    local_780 = 0;
  }
  else {
    local_780 = __dynamic_cast(local_18,&ForceManager::typeinfo,&SPFForceManager::typeinfo,0);
  }
  local_48 = local_780;
  if (local_780 == 0) {
    snprintf(painCave.errMsg,2000,"SPF-RNEMD cannot be used with the default ForceManager.\n");
    painCave.isFatal = 1;
    painCave.severity = 1;
    simError();
  }
  else {
    in_RDI[1].trialCount_ = (undefined4)local_780;
    in_RDI[1].failTrialCount_ = local_780._4_4_;
    *(RNEMD **)(*(long *)&in_RDI[1].trialCount_ + 0xc80) = in_RDI;
  }
  this_00 = SimInfo::getSimParams(local_10);
  local_50 = Globals::getRNEMDParameters(this_00);
  if ((in_RDI->useChargedSPF_ & 1U) != 0) {
    std::_Rb_tree_iterator<std::pair<const_int,_OpenMD::Molecule_*>_>::_Rb_tree_iterator(&local_58);
    std::vector<OpenMD::MoleculeStamp_*,_std::allocator<OpenMD::MoleculeStamp_*>_>::size
              (&in_RDI->objectTypes_);
    std::allocator<double>::allocator((allocator<double> *)0x355989);
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff7f0,
               (size_type)in_stack_fffffffffffff7e8,(allocator_type *)in_stack_fffffffffffff7e0);
    std::allocator<double>::~allocator((allocator<double> *)0x3559b5);
    std::vector<OpenMD::MoleculeStamp_*,_std::allocator<OpenMD::MoleculeStamp_*>_>::size
              (&in_RDI->objectTypes_);
    std::allocator<int>::allocator((allocator<int> *)0x3559e6);
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff7f0,
               (size_type)in_stack_fffffffffffff7e8,(allocator_type *)in_stack_fffffffffffff7e0);
    std::allocator<int>::~allocator((allocator<int> *)0x355a12);
    local_60 = SimInfo::beginMolecule(in_stack_fffffffffffff7f0,in_stack_fffffffffffff7e8);
    while (local_60 != (Molecule *)0x0) {
      for (local_a8 = 0;
          sVar8 = std::vector<OpenMD::MoleculeStamp_*,_std::allocator<OpenMD::MoleculeStamp_*>_>::
                  size(&in_RDI->objectTypes_), local_a8 < sVar8; local_a8 = local_a8 + 1) {
        ppMVar9 = std::vector<OpenMD::MoleculeStamp_*,_std::allocator<OpenMD::MoleculeStamp_*>_>::
                  operator[](&in_RDI->objectTypes_,local_a8);
        pMVar2 = *ppMVar9;
        pMVar10 = Molecule::getMolStamp(local_60);
        if (pMVar2 == pMVar10) {
          in_stack_fffffffffffff820 =
               (SelectionEvaluator *)Molecule::getFixedCharge((Molecule *)in_stack_fffffffffffff7f0)
          ;
          pvVar11 = std::vector<double,_std::allocator<double>_>::operator[](&local_78,local_a8);
          *pvVar11 = (double)in_stack_fffffffffffff820 + *pvVar11;
          pvVar12 = std::vector<int,_std::allocator<int>_>::operator[](&local_98,local_a8);
          *pvVar12 = *pvVar12 + 1;
        }
      }
      in_stack_fffffffffffff818 =
           SimInfo::nextMolecule(in_stack_fffffffffffff7f0,in_stack_fffffffffffff7e8);
      local_60 = in_stack_fffffffffffff818;
    }
    for (local_b0 = 0;
        sVar8 = std::vector<OpenMD::MoleculeStamp_*,_std::allocator<OpenMD::MoleculeStamp_*>_>::size
                          (&in_RDI->objectTypes_), local_b0 < sVar8; local_b0 = local_b0 + 1) {
      SelectionEvaluator::SelectionEvaluator(this_02,(SimInfo *)in_RDI);
      SelectionManager::SelectionManager(in_stack_fffffffffffffa80,in_stack_fffffffffffffa78);
      std::vector<OpenMD::MoleculeStamp_*,_std::allocator<OpenMD::MoleculeStamp_*>_>::operator[]
                (&in_RDI->objectTypes_,local_b0);
      MoleculeStamp::getName_abi_cxx11_
                ((MoleculeStamp *)CONCAT17(in_stack_fffffffffffff7cf,in_stack_fffffffffffff7c8));
      std::operator+((char *)in_stack_fffffffffffff7d8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff7d0);
      std::__cxx11::string::~string(local_708);
      SelectionEvaluator::loadScriptString
                (in_stack_fffffffffffff820,(string *)in_stack_fffffffffffff818);
      SelectionEvaluator::evaluate(in_stack_fffffffffffff808);
      SelectionManager::setSelectionSet
                ((SelectionManager *)in_stack_fffffffffffff7e0,
                 (SelectionSet *)in_stack_fffffffffffff7d8);
      SelectionSet::~SelectionSet((SelectionSet *)0x355cf8);
      pvVar12 = std::vector<int,_std::allocator<int>_>::operator[](&local_98,local_b0);
      if (*pvVar12 < 1) {
        pvVar11 = std::vector<double,_std::allocator<double>_>::operator[](&local_78,local_b0);
        *pvVar11 = 0.0;
      }
      else {
        pvVar12 = std::vector<int,_std::allocator<int>_>::operator[](&local_98,local_b0);
        in_stack_fffffffffffff808 = (SelectionEvaluator *)(double)*pvVar12;
        pvVar11 = std::vector<double,_std::allocator<double>_>::operator[](&local_78,local_b0);
        *pvVar11 = *pvVar11 / (double)in_stack_fffffffffffff808;
        pvVar11 = std::vector<double,_std::allocator<double>_>::operator[](&local_78,local_b0);
        if (*pvVar11 <= 0.0) {
          pvVar11 = std::vector<double,_std::allocator<double>_>::operator[](&local_78,local_b0);
          if (*pvVar11 <= 0.0 && *pvVar11 != 0.0) {
            SelectionManager::operator|=
                      ((SelectionManager *)in_stack_fffffffffffff7e0,in_stack_fffffffffffff7d8);
          }
        }
        else {
          SelectionManager::operator|=
                    ((SelectionManager *)in_stack_fffffffffffff7e0,in_stack_fffffffffffff7d8);
        }
      }
      std::__cxx11::string::~string(local_6e8);
      SelectionManager::~SelectionManager((SelectionManager *)in_stack_fffffffffffff7d0);
      SelectionEvaluator::~SelectionEvaluator(in_stack_fffffffffffff7d0);
    }
    std::vector<int,_std::allocator<int>_>::~vector
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff7e0);
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff7e0);
  }
  bVar4 = RNEMDParameters::haveParticleFlux((RNEMDParameters *)0x355f4b);
  bVar5 = RNEMDParameters::haveCurrentDensity((RNEMDParameters *)0x355f6b);
  bVar6 = RNEMDParameters::haveKineticFlux((RNEMDParameters *)0x355f8b);
  bVar7 = false;
  local_725 = false;
  RVar1 = in_RDI->rnemdFluxType_;
  bVar3 = bVar4;
  if (RVar1 != rnemdParticle) {
    if (RVar1 == rnemdParticleKE) {
      local_801 = false;
      if (bVar4) {
        local_801 = bVar6;
      }
      local_725 = local_801;
      bVar3 = local_725;
    }
    else {
      bVar3 = bVar5;
      if (RVar1 != rnemdCurrentDensity) {
        bVar7 = true;
        bVar3 = local_725;
      }
    }
  }
  local_725 = bVar3;
  if (bVar7) {
    uVar13 = std::__cxx11::string::c_str();
    peVar15 = &painCave;
    snprintf(painCave.errMsg,2000,
             "RNEMD: The current method, SPF\n\tcannot be used with the current flux type, %s\n",
             uVar13);
    peVar15->isFatal = 1;
    peVar15->severity = 1;
    simError();
  }
  if (local_725 == false) {
    uVar13 = std::__cxx11::string::c_str();
    peVar15 = &painCave;
    snprintf(painCave.errMsg,2000,
             "RNEMD: The current method, SPF, and flux type, %s,\n\tdid not have the correct flux type specified. Options\n\tinclude: particleFlux, particleFlux + kineticFlux,\n\tand currentDensity.\n"
             ,uVar13);
    peVar15->isFatal = 1;
    peVar15->severity = 1;
    simError();
  }
  if (bVar4) {
    this_01 = (RNEMD *)RNEMDParameters::getParticleFlux((RNEMDParameters *)0x35610f);
    RNEMD::setParticleFlux(this_01,(RealType)in_stack_fffffffffffff7d8);
  }
  else if (bVar5) {
    RVar14 = RNEMDParameters::getCurrentDensity((RNEMDParameters *)0x356145);
    RNEMD::setParticleFlux(in_stack_fffffffffffff7e0,RVar14);
  }
  else {
    RNEMD::setParticleFlux(in_stack_fffffffffffff7e0,(RealType)in_stack_fffffffffffff7d8);
  }
  if (bVar6) {
    RVar14 = RNEMDParameters::getKineticFlux((RNEMDParameters *)0x356191);
    RNEMD::setKineticFlux(in_RDI,RVar14);
  }
  else {
    RNEMD::setKineticFlux(in_RDI,0.0);
  }
  bVar7 = RNEMDParameters::getSPFUniformKineticScaling((RNEMDParameters *)0x3561d1);
  *(bool *)&in_RDI[1].seleMan_.molecules_.
            super__Vector_base<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = bVar7;
  return;
}

Assistant:

SPFMethod::SPFMethod(SimInfo* info, ForceManager* forceMan) :
      RNEMD {info, forceMan}, smanA_ {info}, smanB_ {info}, anionMan_ {info},
      cationMan_ {info}, selectedMoleculeMan_ {info},
      selectedMoleculeEvaluator_ {info} {
    rnemdMethodLabel_ = "SPF";

    selectedMoleculeStr_ = "select none";
    selectedMoleculeEvaluator_.loadScriptString(selectedMoleculeStr_);
    selectedMoleculeMan_.setSelectionSet(selectedMoleculeEvaluator_.evaluate());

    if (SPFForceManager* spfForceManager =
            dynamic_cast<SPFForceManager*>(forceMan)) {
      forceManager_            = spfForceManager;
      forceManager_->spfRNEMD_ = this;
    } else {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "SPF-RNEMD cannot be used with the default ForceManager.\n");
      painCave.isFatal  = 1;
      painCave.severity = OPENMD_ERROR;
      simError();
    }

    RNEMDParameters* rnemdParams = info->getSimParams()->getRNEMDParameters();

    // Calculate ion fixed charges for use in the Charged-SPF method
    if (useChargedSPF_) {
      SimInfo::MoleculeIterator i;
      Molecule* mol;
      std::vector<RealType> q_tot(objectTypes_.size());
      std::vector<int> molCount(objectTypes_.size());

      for (mol = info_->beginMolecule(i); mol != NULL;
           mol = info_->nextMolecule(i)) {
        for (std::size_t i {}; i < objectTypes_.size(); ++i) {
          if (objectTypes_[i] == mol->getMolStamp()) {
            q_tot[i] += mol->getFixedCharge();
            molCount[i]++;
          }
        }
      }

#ifdef IS_MPI
      MPI_Allreduce(MPI_IN_PLACE, &q_tot[0], q_tot.size(), MPI_REALTYPE,
                    MPI_SUM, MPI_COMM_WORLD);
      MPI_Allreduce(MPI_IN_PLACE, &molCount[0], molCount.size(), MPI_INT,
                    MPI_SUM, MPI_COMM_WORLD);
#endif

      for (std::size_t i {}; i < objectTypes_.size(); ++i) {
        SelectionEvaluator ionEvaluator {info};
        SelectionManager ionManager {info};

        std::string ionStr = "select " + objectTypes_[i]->getName();
        ionEvaluator.loadScriptString(ionStr);
        ionManager.setSelectionSet(ionEvaluator.evaluate());

        if (molCount[i] > 0) {
          q_tot[i] /= molCount[i];

          if (q_tot[i] > 0.0) {
            cationMan_ |= ionManager;
          } else if (q_tot[i] < 0.0) {
            anionMan_ |= ionManager;
          }
        } else {
          q_tot[i] = 0.0;
        }
      }
    }

    bool hasParticleFlux   = rnemdParams->haveParticleFlux();
    bool hasCurrentDensity = rnemdParams->haveCurrentDensity();
    bool hasKineticFlux    = rnemdParams->haveKineticFlux();

    bool methodFluxMismatch = false;
    bool hasCorrectFlux     = false;

    switch (rnemdFluxType_) {
    case rnemdParticle:
      hasCorrectFlux = hasParticleFlux;
      break;
    case rnemdParticleKE:
      hasCorrectFlux = hasParticleFlux && hasKineticFlux;
      break;
    case rnemdCurrentDensity:
      hasCorrectFlux = hasCurrentDensity;
      break;
    default:
      methodFluxMismatch = true;
      break;
    }

    if (methodFluxMismatch) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "RNEMD: The current method, SPF\n"
               "\tcannot be used with the current flux type, %s\n",
               rnemdFluxTypeLabel_.c_str());
      painCave.isFatal  = 1;
      painCave.severity = OPENMD_ERROR;
      simError();
    }

    if (!hasCorrectFlux) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "RNEMD: The current method, SPF, and flux type, %s,\n"
               "\tdid not have the correct flux type specified. Options\n"
               "\tinclude: particleFlux, particleFlux + kineticFlux,\n"
               "\tand currentDensity.\n",
               rnemdFluxTypeLabel_.c_str());
      painCave.isFatal  = 1;
      painCave.severity = OPENMD_ERROR;
      simError();
    }

    if (hasParticleFlux) {
      setParticleFlux(rnemdParams->getParticleFlux());
    } else if (hasCurrentDensity) {
      setParticleFlux(rnemdParams->getCurrentDensity());
    } else {
      setParticleFlux(0.0);
    }

    if (hasKineticFlux) {
      setKineticFlux(rnemdParams->getKineticFlux());
    } else {
      setKineticFlux(0.0);
    }

    uniformKineticScaling_ = rnemdParams->getSPFUniformKineticScaling();
  }